

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O3

void __thiscall
MODEL3D::three_dim_model::generate_freecad_fill
          (three_dim_model *this,Path *outline,Paths *primary,Paths *secondary,int *layer_number)

{
  double *pdVar1;
  uint uVar2;
  pointer pvVar3;
  uint uVar4;
  uint *puVar5;
  three_dim_model *ptVar6;
  Paths *pPVar7;
  uint uVar8;
  long *plVar9;
  undefined8 *puVar10;
  uint uVar11;
  ulong *puVar12;
  size_type *psVar13;
  long *plVar14;
  ulong uVar15;
  pointer pvVar16;
  uint uVar17;
  string __str;
  string __str_12;
  string __str_4;
  string __str_5;
  string __str_3;
  string __str_2;
  string __str_1;
  ulong *local_178;
  long local_170;
  ulong local_168;
  long lStack_160;
  ulong *local_158;
  long local_150;
  ulong local_148;
  long lStack_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  uint *local_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98 [2];
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  long *local_68 [2];
  long local_58 [2];
  three_dim_model *local_48;
  Paths *local_40;
  Paths *local_38;
  
  uVar2 = *layer_number;
  uVar4 = -uVar2;
  if (0 < (int)uVar2) {
    uVar4 = uVar2;
  }
  uVar17 = 1;
  if (9 < uVar4) {
    uVar15 = (ulong)uVar4;
    uVar8 = 4;
    do {
      uVar17 = uVar8;
      uVar11 = (uint)uVar15;
      if (uVar11 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_00153910;
      }
      if (uVar11 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_00153910;
      }
      if (uVar11 < 10000) goto LAB_00153910;
      uVar15 = uVar15 / 10000;
      uVar8 = uVar17 + 4;
    } while (99999 < uVar11);
    uVar17 = uVar17 + 1;
  }
LAB_00153910:
  local_158 = &local_148;
  local_118 = (uint *)layer_number;
  local_40 = secondary;
  local_38 = primary;
  std::__cxx11::string::_M_construct((ulong)&local_158,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_158 + (ulong)(uVar2 >> 0x1f)),uVar17,uVar4);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,0x17959a);
  puVar12 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar12) {
    local_168 = *puVar12;
    lStack_160 = plVar9[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *puVar12;
    local_178 = (ulong *)*plVar9;
  }
  local_170 = plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_178);
  local_b0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->py_script;
  psVar13 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_138.field_2._M_allocated_capacity = *psVar13;
    local_138.field_2._8_8_ = plVar9[3];
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar13;
    local_138._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_138._M_string_length = plVar9[1];
  *plVar9 = (long)psVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_b0,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168 + 1);
  }
  local_48 = this;
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  ptVar6 = local_48;
  puVar5 = local_118;
  pvVar16 = (local_38->
            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (local_38->
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar16 != pvVar3) {
    pdVar1 = &local_48->subtractive_overlap_factor;
    do {
      local_138._M_dataplus._M_p._0_1_ = 1;
      local_178 = (ulong *)((ulong)local_178 & 0xffffffffffffff00);
      push_freecad_pss(ptVar6,pvVar16,(bool *)&local_138,(int *)puVar5,(bool *)&local_178,pdVar1);
      pvVar16 = pvVar16 + 1;
    } while (pvVar16 != pvVar3);
  }
  build_subtractive_shapes(ptVar6,(int *)puVar5);
  uVar2 = *puVar5;
  uVar4 = -uVar2;
  if (0 < (int)uVar2) {
    uVar4 = uVar2;
  }
  uVar17 = 1;
  if (9 < uVar4) {
    uVar15 = (ulong)uVar4;
    uVar8 = 4;
    do {
      uVar17 = uVar8;
      uVar11 = (uint)uVar15;
      if (uVar11 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_00153b28;
      }
      if (uVar11 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_00153b28;
      }
      if (uVar11 < 10000) goto LAB_00153b28;
      uVar15 = uVar15 / 10000;
      uVar8 = uVar17 + 4;
    } while (99999 < uVar11);
    uVar17 = uVar17 + 1;
  }
LAB_00153b28:
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct((ulong)local_68,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_68[0] + (ulong)(uVar2 >> 0x1f)),uVar17,uVar4);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,0x1795bd);
  local_d0 = &local_c0;
  puVar12 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar12) {
    local_c0 = *puVar12;
    lStack_b8 = plVar9[3];
  }
  else {
    local_c0 = *puVar12;
    local_d0 = (ulong *)*plVar9;
  }
  local_c8 = plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_f0 = &local_e0;
  puVar12 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar12) {
    local_e0 = *puVar12;
    lStack_d8 = plVar9[3];
  }
  else {
    local_e0 = *puVar12;
    local_f0 = (ulong *)*plVar9;
  }
  local_e8 = plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  uVar2 = *local_118;
  uVar4 = -uVar2;
  if (0 < (int)uVar2) {
    uVar4 = uVar2;
  }
  uVar17 = 1;
  if (9 < uVar4) {
    uVar15 = (ulong)uVar4;
    uVar8 = 4;
    do {
      uVar17 = uVar8;
      uVar11 = (uint)uVar15;
      if (uVar11 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_00153c91;
      }
      if (uVar11 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_00153c91;
      }
      if (uVar11 < 10000) goto LAB_00153c91;
      uVar15 = uVar15 / 10000;
      uVar8 = uVar17 + 4;
    } while (99999 < uVar11);
    uVar17 = uVar17 + 1;
  }
LAB_00153c91:
  local_88 = local_78;
  std::__cxx11::string::_M_construct((ulong)&local_88,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_88),uVar17,uVar4);
  uVar15 = 0xf;
  if (local_f0 != &local_e0) {
    uVar15 = local_e0;
  }
  if (uVar15 < (ulong)(local_80 + local_e8)) {
    uVar15 = 0xf;
    if (local_88 != local_78) {
      uVar15 = local_78[0];
    }
    if (uVar15 < (ulong)(local_80 + local_e8)) goto LAB_00153d2d;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_00153d2d:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_88);
  }
  local_110 = &local_100;
  plVar9 = puVar10 + 2;
  if ((long *)*puVar10 == plVar9) {
    local_100 = *plVar9;
    lStack_f8 = puVar10[3];
  }
  else {
    local_100 = *plVar9;
    local_110 = (long *)*puVar10;
  }
  local_108 = puVar10[1];
  *puVar10 = plVar9;
  puVar10[1] = 0;
  *(undefined1 *)plVar9 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_110);
  puVar12 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar12) {
    local_148 = *puVar12;
    lStack_140 = plVar9[3];
    local_158 = &local_148;
  }
  else {
    local_148 = *puVar12;
    local_158 = (ulong *)*plVar9;
  }
  local_150 = plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  uVar2 = *local_118;
  uVar4 = -uVar2;
  if (0 < (int)uVar2) {
    uVar4 = uVar2;
  }
  uVar17 = 1;
  if (9 < uVar4) {
    uVar15 = (ulong)uVar4;
    uVar8 = 4;
    do {
      uVar17 = uVar8;
      uVar11 = (uint)uVar15;
      if (uVar11 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_00153e46;
      }
      if (uVar11 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_00153e46;
      }
      if (uVar11 < 10000) goto LAB_00153e46;
      uVar15 = uVar15 / 10000;
      uVar8 = uVar17 + 4;
    } while (99999 < uVar11);
    uVar17 = uVar17 + 1;
  }
LAB_00153e46:
  local_a8 = local_98;
  std::__cxx11::string::_M_construct((ulong)&local_a8,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_a8),uVar17,uVar4);
  uVar15 = 0xf;
  if (local_158 != &local_148) {
    uVar15 = local_148;
  }
  if (uVar15 < (ulong)(local_a0 + local_150)) {
    uVar15 = 0xf;
    if (local_a8 != local_98) {
      uVar15 = local_98[0];
    }
    if (uVar15 < (ulong)(local_a0 + local_150)) goto LAB_00153ede;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_158);
  }
  else {
LAB_00153ede:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_a8);
  }
  puVar12 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar12) {
    local_168 = *puVar12;
    lStack_160 = puVar10[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *puVar12;
    local_178 = (ulong *)*puVar10;
  }
  local_170 = puVar10[1];
  *puVar10 = puVar12;
  puVar10[1] = 0;
  *(undefined1 *)puVar12 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_178);
  psVar13 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_138.field_2._M_allocated_capacity = *psVar13;
    local_138.field_2._8_8_ = plVar9[3];
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar13;
    local_138._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_138._M_string_length = plVar9[1];
  *plVar9 = (long)psVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_b0,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168 + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pPVar7 = local_40;
  if ((local_40->
      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (local_40->
      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar2 = *local_118;
    uVar4 = -uVar2;
    if (0 < (int)uVar2) {
      uVar4 = uVar2;
    }
    uVar17 = 1;
    if (9 < uVar4) {
      uVar15 = (ulong)uVar4;
      uVar8 = 4;
      do {
        uVar17 = uVar8;
        uVar11 = (uint)uVar15;
        if (uVar11 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_00154c8e;
        }
        if (uVar11 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_00154c8e;
        }
        if (uVar11 < 10000) goto LAB_00154c8e;
        uVar15 = uVar15 / 10000;
        uVar8 = uVar17 + 4;
      } while (99999 < uVar11);
      uVar17 = uVar17 + 1;
    }
LAB_00154c8e:
    local_110 = &local_100;
    std::__cxx11::string::_M_construct((ulong)&local_110,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_110 + (ulong)(uVar2 >> 0x1f)),uVar17,uVar4);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x179653);
    puVar12 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar12) {
      local_148 = *puVar12;
      lStack_140 = plVar9[3];
      local_158 = &local_148;
    }
    else {
      local_148 = *puVar12;
      local_158 = (ulong *)*plVar9;
    }
    local_150 = plVar9[1];
    *plVar9 = (long)puVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
    puVar12 = puVar10 + 2;
    if ((ulong *)*puVar10 == puVar12) {
      local_168 = *puVar12;
      lStack_160 = puVar10[3];
      local_178 = &local_168;
    }
    else {
      local_168 = *puVar12;
      local_178 = (ulong *)*puVar10;
    }
    local_170 = puVar10[1];
    *puVar10 = puVar12;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    uVar2 = *local_118;
    uVar4 = -uVar2;
    if (0 < (int)uVar2) {
      uVar4 = uVar2;
    }
    uVar17 = 1;
    if (9 < uVar4) {
      uVar15 = (ulong)uVar4;
      uVar8 = 4;
      do {
        uVar17 = uVar8;
        uVar11 = (uint)uVar15;
        if (uVar11 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_00154dd0;
        }
        if (uVar11 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_00154dd0;
        }
        if (uVar11 < 10000) goto LAB_00154dd0;
        uVar15 = uVar15 / 10000;
        uVar8 = uVar17 + 4;
      } while (99999 < uVar11);
      uVar17 = uVar17 + 1;
    }
LAB_00154dd0:
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct((ulong)&local_f0,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_f0),uVar17,uVar4);
    uVar15 = 0xf;
    if (local_178 != &local_168) {
      uVar15 = local_168;
    }
    if (uVar15 < (ulong)(local_e8 + local_170)) {
      uVar15 = 0xf;
      if (local_f0 != &local_e0) {
        uVar15 = local_e0;
      }
      if (uVar15 < (ulong)(local_e8 + local_170)) goto LAB_00154e4e;
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_178);
    }
    else {
LAB_00154e4e:
      puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_f0);
    }
    psVar13 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_138.field_2._M_allocated_capacity = *psVar13;
      local_138.field_2._8_8_ = puVar10[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar13;
      local_138._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_138._M_string_length = puVar10[1];
    *puVar10 = psVar13;
    puVar10[1] = 0;
    *(undefined1 *)psVar13 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_b0,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,local_168 + 1);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    local_58[0] = local_100;
    plVar9 = local_110;
    if (local_110 != &local_100) goto LAB_00154f34;
  }
  else {
    uVar2 = *local_118;
    uVar4 = -uVar2;
    if (0 < (int)uVar2) {
      uVar4 = uVar2;
    }
    uVar17 = 1;
    if (9 < uVar4) {
      uVar15 = (ulong)uVar4;
      uVar8 = 4;
      do {
        uVar17 = uVar8;
        uVar11 = (uint)uVar15;
        if (uVar11 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_00154193;
        }
        if (uVar11 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_00154193;
        }
        if (uVar11 < 10000) goto LAB_00154193;
        uVar15 = uVar15 / 10000;
        uVar8 = uVar17 + 4;
      } while (99999 < uVar11);
      uVar17 = uVar17 + 1;
    }
LAB_00154193:
    local_158 = &local_148;
    std::__cxx11::string::_M_construct((ulong)&local_158,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_158 + (ulong)(uVar2 >> 0x1f)),uVar17,uVar4);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,0x1795f7);
    puVar12 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar12) {
      local_168 = *puVar12;
      lStack_160 = plVar9[3];
      local_178 = &local_168;
    }
    else {
      local_168 = *puVar12;
      local_178 = (ulong *)*plVar9;
    }
    local_170 = plVar9[1];
    *plVar9 = (long)puVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_178);
    psVar13 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_138.field_2._M_allocated_capacity = *psVar13;
      local_138.field_2._8_8_ = plVar9[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar13;
      local_138._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_138._M_string_length = plVar9[1];
    *plVar9 = (long)psVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_b0,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,local_168 + 1);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    ptVar6 = local_48;
    puVar5 = local_118;
    pvVar16 = (pPVar7->
              super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (pPVar7->
             super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar16 != pvVar3) {
      pdVar1 = &local_48->island_overlap_factor;
      do {
        local_138._M_dataplus._M_p = local_138._M_dataplus._M_p & 0xffffffffffffff00;
        local_178 = (ulong *)CONCAT71(local_178._1_7_,1);
        push_freecad_pss(ptVar6,pvVar16,(bool *)&local_138,(int *)puVar5,(bool *)&local_178,pdVar1);
        pvVar16 = pvVar16 + 1;
      } while (pvVar16 != pvVar3);
    }
    uVar2 = *puVar5;
    uVar4 = -uVar2;
    if (0 < (int)uVar2) {
      uVar4 = uVar2;
    }
    uVar17 = 1;
    if (9 < uVar4) {
      uVar15 = (ulong)uVar4;
      uVar8 = 4;
      do {
        uVar17 = uVar8;
        uVar11 = (uint)uVar15;
        if (uVar11 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_0015437f;
        }
        if (uVar11 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_0015437f;
        }
        if (uVar11 < 10000) goto LAB_0015437f;
        uVar15 = uVar15 / 10000;
        uVar8 = uVar17 + 4;
      } while (99999 < uVar11);
      uVar17 = uVar17 + 1;
    }
LAB_0015437f:
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct((ulong)&local_f0,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_f0 + (ulong)(uVar2 >> 0x1f)),uVar17,uVar4);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x179611);
    local_110 = &local_100;
    plVar14 = plVar9 + 2;
    if ((long *)*plVar9 == plVar14) {
      local_100 = *plVar14;
      lStack_f8 = plVar9[3];
    }
    else {
      local_100 = *plVar14;
      local_110 = (long *)*plVar9;
    }
    local_108 = plVar9[1];
    *plVar9 = (long)plVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_110);
    puVar12 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar12) {
      local_148 = *puVar12;
      lStack_140 = plVar9[3];
      local_158 = &local_148;
    }
    else {
      local_148 = *puVar12;
      local_158 = (ulong *)*plVar9;
    }
    local_150 = plVar9[1];
    *plVar9 = (long)puVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    uVar2 = *local_118;
    uVar4 = -uVar2;
    if (0 < (int)uVar2) {
      uVar4 = uVar2;
    }
    uVar17 = 1;
    if (9 < uVar4) {
      uVar15 = (ulong)uVar4;
      uVar8 = 4;
      do {
        uVar17 = uVar8;
        uVar11 = (uint)uVar15;
        if (uVar11 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_001544c4;
        }
        if (uVar11 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_001544c4;
        }
        if (uVar11 < 10000) goto LAB_001544c4;
        uVar15 = uVar15 / 10000;
        uVar8 = uVar17 + 4;
      } while (99999 < uVar11);
      uVar17 = uVar17 + 1;
    }
LAB_001544c4:
    local_d0 = &local_c0;
    std::__cxx11::string::_M_construct((ulong)&local_d0,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_d0),uVar17,uVar4);
    uVar15 = 0xf;
    if (local_158 != &local_148) {
      uVar15 = local_148;
    }
    if (uVar15 < (ulong)(local_c8 + local_150)) {
      uVar15 = 0xf;
      if (local_d0 != &local_c0) {
        uVar15 = local_c0;
      }
      if (uVar15 < (ulong)(local_c8 + local_150)) goto LAB_00154553;
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_158);
    }
    else {
LAB_00154553:
      puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_d0);
    }
    puVar12 = puVar10 + 2;
    if ((ulong *)*puVar10 == puVar12) {
      local_168 = *puVar12;
      lStack_160 = puVar10[3];
      local_178 = &local_168;
    }
    else {
      local_168 = *puVar12;
      local_178 = (ulong *)*puVar10;
    }
    local_170 = puVar10[1];
    *puVar10 = puVar12;
    puVar10[1] = 0;
    *(undefined1 *)puVar12 = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_178);
    psVar13 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_138.field_2._M_allocated_capacity = *psVar13;
      local_138.field_2._8_8_ = plVar9[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar13;
      local_138._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_138._M_string_length = plVar9[1];
    *plVar9 = (long)psVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_b0,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,local_168 + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    uVar2 = *local_118;
    uVar4 = -uVar2;
    if (0 < (int)uVar2) {
      uVar4 = uVar2;
    }
    uVar17 = 1;
    if (9 < uVar4) {
      uVar15 = (ulong)uVar4;
      uVar8 = 4;
      do {
        uVar17 = uVar8;
        uVar11 = (uint)uVar15;
        if (uVar11 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_0015470e;
        }
        if (uVar11 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_0015470e;
        }
        if (uVar11 < 10000) goto LAB_0015470e;
        uVar15 = uVar15 / 10000;
        uVar8 = uVar17 + 4;
      } while (99999 < uVar11);
      uVar17 = uVar17 + 1;
    }
LAB_0015470e:
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct((ulong)local_68,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_68[0] + (ulong)(uVar2 >> 0x1f)),uVar17,uVar4);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,0x179653);
    local_d0 = &local_c0;
    puVar12 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar12) {
      local_c0 = *puVar12;
      lStack_b8 = plVar9[3];
    }
    else {
      local_c0 = *puVar12;
      local_d0 = (ulong *)*plVar9;
    }
    local_c8 = plVar9[1];
    *plVar9 = (long)puVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_d0);
    puVar12 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar12) {
      local_e0 = *puVar12;
      lStack_d8 = plVar9[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *puVar12;
      local_f0 = (ulong *)*plVar9;
    }
    local_e8 = plVar9[1];
    *plVar9 = (long)puVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    uVar2 = *local_118;
    uVar4 = -uVar2;
    if (0 < (int)uVar2) {
      uVar4 = uVar2;
    }
    uVar17 = 1;
    if (9 < uVar4) {
      uVar15 = (ulong)uVar4;
      uVar8 = 4;
      do {
        uVar17 = uVar8;
        uVar11 = (uint)uVar15;
        if (uVar11 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_00154877;
        }
        if (uVar11 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_00154877;
        }
        if (uVar11 < 10000) goto LAB_00154877;
        uVar15 = uVar15 / 10000;
        uVar8 = uVar17 + 4;
      } while (99999 < uVar11);
      uVar17 = uVar17 + 1;
    }
LAB_00154877:
    local_88 = local_78;
    std::__cxx11::string::_M_construct((ulong)&local_88,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_88),uVar17,uVar4);
    uVar15 = 0xf;
    if (local_f0 != &local_e0) {
      uVar15 = local_e0;
    }
    if (uVar15 < (ulong)(local_80 + local_e8)) {
      uVar15 = 0xf;
      if (local_88 != local_78) {
        uVar15 = local_78[0];
      }
      if (uVar15 < (ulong)(local_80 + local_e8)) goto LAB_0015490f;
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_f0);
    }
    else {
LAB_0015490f:
      puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_88);
    }
    plVar9 = puVar10 + 2;
    if ((long *)*puVar10 == plVar9) {
      local_100 = *plVar9;
      lStack_f8 = puVar10[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar9;
      local_110 = (long *)*puVar10;
    }
    local_108 = puVar10[1];
    *puVar10 = plVar9;
    puVar10[1] = 0;
    *(undefined1 *)plVar9 = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_110);
    puVar12 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar12) {
      local_148 = *puVar12;
      lStack_140 = plVar9[3];
      local_158 = &local_148;
    }
    else {
      local_148 = *puVar12;
      local_158 = (ulong *)*plVar9;
    }
    local_150 = plVar9[1];
    *plVar9 = (long)puVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    uVar2 = *local_118;
    uVar4 = -uVar2;
    if (0 < (int)uVar2) {
      uVar4 = uVar2;
    }
    uVar17 = 1;
    if (9 < uVar4) {
      uVar15 = (ulong)uVar4;
      uVar8 = 4;
      do {
        uVar17 = uVar8;
        uVar11 = (uint)uVar15;
        if (uVar11 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_00154a24;
        }
        if (uVar11 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_00154a24;
        }
        if (uVar11 < 10000) goto LAB_00154a24;
        uVar15 = uVar15 / 10000;
        uVar8 = uVar17 + 4;
      } while (99999 < uVar11);
      uVar17 = uVar17 + 1;
    }
LAB_00154a24:
    local_a8 = local_98;
    std::__cxx11::string::_M_construct((ulong)&local_a8,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_a8),uVar17,uVar4);
    uVar15 = 0xf;
    if (local_158 != &local_148) {
      uVar15 = local_148;
    }
    if (uVar15 < (ulong)(local_a0 + local_150)) {
      uVar15 = 0xf;
      if (local_a8 != local_98) {
        uVar15 = local_98[0];
      }
      if (uVar15 < (ulong)(local_a0 + local_150)) goto LAB_00154abb;
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_158);
    }
    else {
LAB_00154abb:
      puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_a8);
    }
    puVar12 = puVar10 + 2;
    if ((ulong *)*puVar10 == puVar12) {
      local_168 = *puVar12;
      lStack_160 = puVar10[3];
      local_178 = &local_168;
    }
    else {
      local_168 = *puVar12;
      local_178 = (ulong *)*puVar10;
    }
    local_170 = puVar10[1];
    *puVar10 = puVar12;
    puVar10[1] = 0;
    *(undefined1 *)puVar12 = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
    psVar13 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_138.field_2._M_allocated_capacity = *psVar13;
      local_138.field_2._8_8_ = puVar10[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar13;
      local_138._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_138._M_string_length = puVar10[1];
    *puVar10 = psVar13;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_b0,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,local_168 + 1);
    }
    if (local_a8 != local_98) {
      operator_delete(local_a8,local_98[0] + 1);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_88 != local_78) {
      operator_delete(local_88,local_78[0] + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    plVar9 = local_68[0];
    if (local_68[0] != local_58) {
LAB_00154f34:
      operator_delete(plVar9,local_58[0] + 1);
    }
  }
  uVar2 = *local_118;
  uVar4 = -uVar2;
  if (0 < (int)uVar2) {
    uVar4 = uVar2;
  }
  uVar17 = 1;
  if (9 < uVar4) {
    uVar15 = (ulong)uVar4;
    uVar8 = 4;
    do {
      uVar17 = uVar8;
      uVar11 = (uint)uVar15;
      if (uVar11 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_00154f9b;
      }
      if (uVar11 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_00154f9b;
      }
      if (uVar11 < 10000) goto LAB_00154f9b;
      uVar15 = uVar15 / 10000;
      uVar8 = uVar17 + 4;
    } while (99999 < uVar11);
    uVar17 = uVar17 + 1;
  }
LAB_00154f9b:
  local_f0 = &local_e0;
  std::__cxx11::string::_M_construct((ulong)&local_f0,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_f0 + (ulong)(uVar2 >> 0x1f)),uVar17,uVar4);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x179670);
  local_110 = &local_100;
  plVar14 = plVar9 + 2;
  if ((long *)*plVar9 == plVar14) {
    local_100 = *plVar14;
    lStack_f8 = plVar9[3];
  }
  else {
    local_100 = *plVar14;
    local_110 = (long *)*plVar9;
  }
  local_108 = plVar9[1];
  *plVar9 = (long)plVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_110);
  puVar12 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar12) {
    local_148 = *puVar12;
    lStack_140 = plVar9[3];
    local_158 = &local_148;
  }
  else {
    local_148 = *puVar12;
    local_158 = (ulong *)*plVar9;
  }
  local_150 = plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  uVar2 = *local_118;
  uVar4 = -uVar2;
  if (0 < (int)uVar2) {
    uVar4 = uVar2;
  }
  uVar17 = 1;
  if (9 < uVar4) {
    uVar15 = (ulong)uVar4;
    uVar8 = 4;
    do {
      uVar17 = uVar8;
      uVar11 = (uint)uVar15;
      if (uVar11 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_001550e0;
      }
      if (uVar11 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_001550e0;
      }
      if (uVar11 < 10000) goto LAB_001550e0;
      uVar15 = uVar15 / 10000;
      uVar8 = uVar17 + 4;
    } while (99999 < uVar11);
    uVar17 = uVar17 + 1;
  }
LAB_001550e0:
  local_d0 = &local_c0;
  std::__cxx11::string::_M_construct((ulong)&local_d0,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_d0),uVar17,uVar4);
  uVar15 = 0xf;
  if (local_158 != &local_148) {
    uVar15 = local_148;
  }
  if (uVar15 < (ulong)(local_c8 + local_150)) {
    uVar15 = 0xf;
    if (local_d0 != &local_c0) {
      uVar15 = local_c0;
    }
    if (uVar15 < (ulong)(local_c8 + local_150)) goto LAB_0015516f;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_158);
  }
  else {
LAB_0015516f:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_d0);
  }
  puVar12 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar12) {
    local_168 = *puVar12;
    lStack_160 = puVar10[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *puVar12;
    local_178 = (ulong *)*puVar10;
  }
  local_170 = puVar10[1];
  *puVar10 = puVar12;
  puVar10[1] = 0;
  *(undefined1 *)puVar12 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_178);
  psVar13 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_138.field_2._M_allocated_capacity = *psVar13;
    local_138.field_2._8_8_ = plVar9[3];
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar13;
    local_138._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_138._M_string_length = plVar9[1];
  *plVar9 = (long)psVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_b0,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  uVar2 = *local_118;
  uVar4 = -uVar2;
  if (0 < (int)uVar2) {
    uVar4 = uVar2;
  }
  uVar17 = 1;
  if (9 < uVar4) {
    uVar15 = (ulong)uVar4;
    uVar8 = 4;
    do {
      uVar17 = uVar8;
      uVar11 = (uint)uVar15;
      if (uVar11 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_0015532a;
      }
      if (uVar11 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_0015532a;
      }
      if (uVar11 < 10000) goto LAB_0015532a;
      uVar15 = uVar15 / 10000;
      uVar8 = uVar17 + 4;
    } while (99999 < uVar11);
    uVar17 = uVar17 + 1;
  }
LAB_0015532a:
  local_110 = &local_100;
  std::__cxx11::string::_M_construct((ulong)&local_110,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_110 + (ulong)(uVar2 >> 0x1f)),uVar17,uVar4);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x179670);
  puVar5 = local_118;
  puVar12 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar12) {
    local_148 = *puVar12;
    lStack_140 = plVar9[3];
    local_158 = &local_148;
  }
  else {
    local_148 = *puVar12;
    local_158 = (ulong *)*plVar9;
  }
  local_150 = plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_158);
  puVar12 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar12) {
    local_168 = *puVar12;
    lStack_160 = plVar9[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *puVar12;
    local_178 = (ulong *)*plVar9;
  }
  local_170 = plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  uVar2 = *puVar5;
  uVar4 = -uVar2;
  if (0 < (int)uVar2) {
    uVar4 = uVar2;
  }
  uVar17 = 1;
  if (9 < uVar4) {
    uVar15 = (ulong)uVar4;
    uVar8 = 4;
    do {
      uVar17 = uVar8;
      uVar11 = (uint)uVar15;
      if (uVar11 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_0015546b;
      }
      if (uVar11 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_0015546b;
      }
      if (uVar11 < 10000) goto LAB_0015546b;
      uVar15 = uVar15 / 10000;
      uVar8 = uVar17 + 4;
    } while (99999 < uVar11);
    uVar17 = uVar17 + 1;
  }
LAB_0015546b:
  local_f0 = &local_e0;
  std::__cxx11::string::_M_construct((ulong)&local_f0,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_f0),uVar17,uVar4);
  uVar15 = 0xf;
  if (local_178 != &local_168) {
    uVar15 = local_168;
  }
  if (uVar15 < (ulong)(local_e8 + local_170)) {
    uVar15 = 0xf;
    if (local_f0 != &local_e0) {
      uVar15 = local_e0;
    }
    if ((ulong)(local_e8 + local_170) <= uVar15) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_178);
      goto LAB_00155509;
    }
  }
  puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_f0);
LAB_00155509:
  psVar13 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_138.field_2._M_allocated_capacity = *psVar13;
    local_138.field_2._8_8_ = puVar10[3];
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar13;
    local_138._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_138._M_string_length = puVar10[1];
  *puVar10 = psVar13;
  puVar10[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_b0,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168 + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  return;
}

Assistant:

void MODEL3D::three_dim_model::generate_freecad_fill(
const ClipperLib::Path &outline,
const ClipperLib::Paths &primary,
const ClipperLib::Paths &secondary,
const int &layer_number)
{
    // Create the list of subtractive shapes
    py_script.push_back("    subtractive_ingredients_"+std::to_string(layer_number)+" = []");
    auto primary_end = primary.end();
    for (auto primary_it = primary.begin();
         primary_it != primary_end;
         primary_it++)
    {
        push_freecad_pss(*primary_it, true, layer_number, false, subtractive_overlap_factor);
    }
    // Build them in python as a list
    build_subtractive_shapes(layer_number);
    // Execute the boolean cut.
    py_script.push_back("    subtractive_cut_"
    +std::to_string(layer_number)
    +"= additive_block_"
    +std::to_string(layer_number)
    +".cut(subtractives_"
    +std::to_string(layer_number)+")");
    // if additive shapes exist
    // Create the list of additive shapes
    if(secondary.size()>0)
    {
        py_script.push_back("    additive_ingredients_"+std::to_string(layer_number)+" = []");
        auto secondary_end = secondary.end();
        for (auto secondary_it = secondary.begin();
            secondary_it != secondary_end;
            secondary_it++)
        {
            push_freecad_pss(*secondary_it, false, layer_number, true, island_overlap_factor);
        }
        // Generate the additive shapes
        py_script.push_back("    additives_"
        +std::to_string(layer_number)+
        " = list(pool.map(create_pss, additive_ingredients_"
        +std::to_string(layer_number)+"))");
        // Execute the boolean fuse
        py_script.push_back("    layer_"
        +std::to_string(layer_number)
        +"=subtractive_cut_"
        +std::to_string(layer_number)
        +".fuse(additives_"
        +std::to_string(layer_number)+")");
    }
    else
    {
        py_script.push_back("    layer_"
        +std::to_string(layer_number)
        +"=subtractive_cut_"
        +std::to_string(layer_number) );
    }
    // py_script.push_back("    Part.show(layer_"
    // +std::to_string(layer_number)+")");
    py_script.push_back("    lyr_"
    +std::to_string(layer_number)+" = My_doc.addObject(\"Part::Feature\",\"layer_"
    +std::to_string(layer_number)+"\")");
    py_script.push_back("    lyr_"+std::to_string(layer_number)
    +".Shape = layer_"+std::to_string(layer_number));
}